

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_events_cpp.cpp
# Opt level: O1

int __thiscall Events::close(Events *this,int __fd)

{
  int iVar1;
  char *pcVar2;
  undefined4 in_register_00000034;
  
  if ((mfb_window *)CONCAT44(in_register_00000034,__fd) == (mfb_window *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = (char *)mfb_get_user_data((mfb_window *)CONCAT44(in_register_00000034,__fd));
  }
  iVar1 = fprintf(_stdout,"%s > close\n",pcVar2);
  return (int)CONCAT71((uint7)(uint3)((uint)iVar1 >> 8),1);
}

Assistant:

bool close(struct mfb_window *window) {
        const char* window_title = "";
        if (window) {
            window_title = (const char*) mfb_get_user_data(window);
        }
        fprintf(stdout, "%s > close\n", window_title);
        return true;    // true => confirm close
                        // false => don't close
    }